

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O2

void __thiscall Fl_Tree_Item::~Fl_Tree_Item(Fl_Tree_Item *this)

{
  if (this->_label != (char *)0x0) {
    free(this->_label);
    this->_label = (char *)0x0;
  }
  this->_widget = (Fl_Widget *)0x0;
  this->_usericon = (Fl_Image *)0x0;
  Fl_Tree_Item_Array::~Fl_Tree_Item_Array(&this->_children);
  return;
}

Assistant:

Fl_Tree_Item::~Fl_Tree_Item() {
  if ( _label ) { 
    free((void*)_label);
    _label = 0;
  }
  _widget = 0;			// Fl_Group will handle destruction
  _usericon = 0;		// user handled allocation
#if FLTK_ABI_VERSION >= 10304
  _userdeicon = 0;		// user handled allocation
#endif
#if FLTK_ABI_VERSION >= 10303
  // focus item? set to null
  if ( _tree && this == _tree->_item_focus )
    { _tree->_item_focus = 0; }
#endif
  //_children.clear();		// array's destructor handles itself
}